

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_accept_op_base<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
::reactive_socket_accept_op_base
          (reactive_socket_accept_op_base<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
           *this,error_code *success_ec,socket_type socket,state_type state,
          basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *peer,tcp *protocol,
          endpoint *peer_endpoint,func_type complete_func)

{
  size_t local_58;
  tcp *protocol_local;
  basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *peer_local;
  state_type state_local;
  socket_type socket_local;
  error_code *success_ec_local;
  reactive_socket_accept_op_base<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
  *this_local;
  
  reactor_op::reactor_op(&this->super_reactor_op,success_ec,do_perform,complete_func);
  this->socket_ = socket;
  this->state_ = state;
  socket_holder::socket_holder(&this->new_socket_);
  this->peer_ = peer;
  (this->protocol_).family_ = protocol->family_;
  this->peer_endpoint_ = peer_endpoint;
  if (peer_endpoint == (endpoint *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = ip::basic_endpoint<asio::ip::tcp>::capacity(peer_endpoint);
  }
  this->addrlen_ = local_58;
  return;
}

Assistant:

reactive_socket_accept_op_base(const asio::error_code& success_ec,
      socket_type socket, socket_ops::state_type state, Socket& peer,
      const Protocol& protocol, typename Protocol::endpoint* peer_endpoint,
      func_type complete_func)
    : reactor_op(success_ec,
        &reactive_socket_accept_op_base::do_perform, complete_func),
      socket_(socket),
      state_(state),
      peer_(peer),
      protocol_(protocol),
      peer_endpoint_(peer_endpoint),
      addrlen_(peer_endpoint ? peer_endpoint->capacity() : 0)
  {
  }